

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void writeSamples(FILE *outFile,vector<float_*,_std::allocator<float_*>_> *outChannelBufs,
                 int channels,int samples,int bytesPerSample)

{
  pointer ppfVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  void *__ptr;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  undefined1 in_XMM8 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  long lVar26;
  
  iVar3 = samples * channels * bytesPerSample;
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar13 = (long)iVar3;
  }
  __ptr = operator_new__(uVar13);
  auVar2 = _DAT_0010b090;
  iVar9 = 0x80 << ((char)bytesPerSample * '\b' - 8U & 0x1f);
  if (0 < samples) {
    iVar10 = 2 - iVar9;
    iVar9 = iVar9 + -2;
    lVar5 = (ulong)(uint)bytesPerSample - 1;
    auVar14._8_4_ = (int)lVar5;
    auVar14._0_8_ = lVar5;
    auVar14._12_4_ = (int)((ulong)lVar5 >> 0x20);
    iVar4 = 0;
    auVar14 = auVar14 ^ _DAT_0010b090;
    uVar13 = 0;
    do {
      if (0 < channels) {
        ppfVar1 = (outChannelBufs->super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = 0;
        iVar11 = iVar4;
        do {
          iVar12 = (int)ppfVar1[uVar6][uVar13];
          if (iVar12 < iVar10) {
            iVar12 = iVar10;
          }
          if (iVar9 < iVar12) {
            iVar12 = iVar9;
          }
          if (0 < bytesPerSample) {
            lVar5 = (long)iVar11;
            bVar7 = 0x18;
            uVar8 = 0;
            auVar25 = _DAT_0010b080;
            auVar27 = _DAT_0010b070;
            do {
              auVar17 = auVar25 ^ auVar2;
              iVar21 = -(uint)(auVar14._0_4_ < auVar17._0_4_);
              iVar15 = auVar14._4_4_;
              auVar18._4_4_ = -(uint)(iVar15 < auVar17._4_4_);
              iVar22 = -(uint)(auVar14._8_4_ < auVar17._8_4_);
              iVar16 = auVar14._12_4_;
              auVar18._12_4_ = -(uint)(iVar16 < auVar17._12_4_);
              auVar19._4_4_ = iVar21;
              auVar19._0_4_ = iVar21;
              auVar19._8_4_ = iVar22;
              auVar19._12_4_ = iVar22;
              auVar23 = pshuflw(in_XMM8,auVar19,0xe8);
              auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar15);
              auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar16);
              auVar20._0_4_ = auVar20._4_4_;
              auVar20._8_4_ = auVar20._12_4_;
              auVar24 = pshuflw(auVar2,auVar20,0xe8);
              auVar18._0_4_ = auVar18._4_4_;
              auVar18._8_4_ = auVar18._12_4_;
              auVar17 = pshuflw(auVar23,auVar18,0xe8);
              auVar17 = (auVar17 | auVar24 & auVar23) ^ _DAT_0010b0b0;
              auVar17 = packssdw(auVar17,auVar17);
              if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(char *)((long)__ptr + uVar8 + lVar5) = (char)iVar12;
              }
              auVar18 = auVar20 & auVar19 | auVar18;
              auVar17 = packssdw(auVar18,auVar18);
              auVar17 = packssdw(auVar17 ^ _DAT_0010b0b0,auVar17 ^ _DAT_0010b0b0);
              auVar17 = packsswb(auVar17,auVar17);
              if ((auVar17._0_4_ >> 8 & 1) != 0) {
                *(char *)((long)__ptr + uVar8 + lVar5 + 1) = (char)(iVar12 >> (bVar7 - 0x10 & 0x1f))
                ;
              }
              auVar20 = auVar27 ^ auVar2;
              iVar21 = -(uint)(auVar14._0_4_ < auVar20._0_4_);
              auVar24._4_4_ = -(uint)(iVar15 < auVar20._4_4_);
              iVar22 = -(uint)(auVar14._8_4_ < auVar20._8_4_);
              auVar24._12_4_ = -(uint)(iVar16 < auVar20._12_4_);
              auVar17._4_4_ = iVar21;
              auVar17._0_4_ = iVar21;
              auVar17._8_4_ = iVar22;
              auVar17._12_4_ = iVar22;
              auVar23._4_4_ = -(uint)(auVar20._4_4_ == iVar15);
              auVar23._12_4_ = -(uint)(auVar20._12_4_ == iVar16);
              auVar23._0_4_ = auVar23._4_4_;
              auVar23._8_4_ = auVar23._12_4_;
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar20 = auVar23 & auVar17 | auVar24;
              auVar20 = packssdw(auVar20,auVar20);
              auVar20 = packssdw(auVar20 ^ _DAT_0010b0b0,auVar20 ^ _DAT_0010b0b0);
              in_XMM8 = packsswb(auVar20,auVar20);
              if ((in_XMM8._0_4_ >> 0x10 & 1) != 0) {
                *(char *)((long)__ptr + uVar8 + lVar5 + 2) = (char)(iVar12 >> (bVar7 - 8 & 0x1f));
              }
              auVar17 = pshufhw(auVar17,auVar17,0x84);
              auVar18 = pshufhw(auVar23,auVar23,0x84);
              auVar20 = pshufhw(auVar17,auVar24,0x84);
              auVar17 = (auVar20 | auVar18 & auVar17) ^ _DAT_0010b0b0;
              auVar17 = packssdw(auVar17,auVar17);
              auVar17 = packsswb(auVar17,auVar17);
              if ((auVar17._0_4_ >> 0x18 & 1) != 0) {
                *(char *)((long)__ptr + uVar8 + lVar5 + 3) = (char)(iVar12 >> (bVar7 & 0x1f));
              }
              uVar8 = uVar8 + 0x10;
              lVar26 = auVar25._8_8_;
              auVar25._0_8_ = auVar25._0_8_ + 0x10;
              auVar25._8_8_ = lVar26 + 0x10;
              lVar26 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 0x10;
              auVar27._8_8_ = lVar26 + 0x10;
              bVar7 = bVar7 + 0x80;
            } while ((bytesPerSample + 0xfU & 0xfffffff0) != uVar8);
          }
          uVar6 = uVar6 + 1;
          iVar11 = iVar11 + bytesPerSample;
        } while (uVar6 != (uint)channels);
      }
      uVar13 = uVar13 + 1;
      iVar4 = iVar4 + bytesPerSample * channels;
    } while (uVar13 != (uint)samples);
  }
  fwrite(__ptr,1,(long)iVar3,(FILE *)outFile);
  return;
}

Assistant:

void writeSamples(FILE* outFile, std::vector<float*> outChannelBufs, int channels, int samples, int bytesPerSample){
	int ioBlockSize = channels * samples * bytesPerSample;
	uint8_t *outBufInterleaved = new uint8_t[ioBlockSize];
	int32_t maxAbsSampleVal = (0x80 << ((bytesPerSample - 1) * 8)) - 2;
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			int32_t sample = (int32_t) outChannelBufs[c][i];
			sample = std::min(std::max(sample, -maxAbsSampleVal), maxAbsSampleVal);
			for(int b = 0; b < bytesPerSample; b++){
				outBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b] = (sample >> (8 * b)) & 0xff;
			}
		}
	}
	fwrite(outBufInterleaved, 1, ioBlockSize, outFile);
}